

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list2cpp.cpp
# Opt level: O2

void __thiscall lst::OutputList::outputToFileAsChar(OutputList *this,ostream *file,string *varname)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  poVar1 = std::operator<<(file,"inline constexpr unsigned long ");
  poVar1 = std::operator<<(poVar1,(string *)varname);
  poVar1 = std::operator<<(poVar1,"_size = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,";\n");
  poVar1 = std::operator<<(file,"\ninline const char *");
  poVar1 = std::operator<<(poVar1,(string *)varname);
  poVar1 = std::operator<<(poVar1,"_arr[");
  poVar1 = std::operator<<(poVar1,(string *)varname);
  std::operator<<(poVar1,"_size] = {\n");
  lVar3 = 0;
  for (uVar5 = 0;
      uVar4 = (long)(this->items).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->items).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5, uVar5 < uVar4; uVar5 = uVar5 + 1
      ) {
    poVar1 = std::operator<<(file,"\"");
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((long)&(((this->items).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar3));
    pcVar2 = "\",\n";
    if (uVar4 - 2 < uVar5) {
      pcVar2 = "\"\n};\n";
    }
    std::operator<<(poVar1,pcVar2);
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void OutputList::outputToFileAsChar(std::ostream &file, std::string varname) {
        file << "inline constexpr unsigned long " << varname << "_size = " << size() << ";\n";
        file << "\ninline const char *" << varname << "_arr[" << varname << "_size] = {\n";
        for(std::size_t i = 0; i < size(); ++i) {
            if(i > size()-2) {
                file << "\"" << items[i] << "\"\n};\n";
            } else {
                file << "\"" << items[i] << "\",\n";
            }
        }
    }